

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_helper.h
# Opt level: O2

void spdlog::details::fmt_helper::pad2(int n,memory_buf_t *dest)

{
  ushort uVar1;
  string_view fmt;
  format_args args;
  ulong local_28 [2];
  
  if ((uint)n < 100) {
    uVar1 = (ushort)n & 0xff;
    local_28[0] = CONCAT71(local_28[0]._1_7_,(char)(uVar1 / 10)) | 0x30;
    ::fmt::v9::detail::buffer<char>::push_back(&dest->super_buffer<char>,(char *)local_28);
    local_28[0] = CONCAT71(local_28[0]._1_7_,(char)(uVar1 % 10)) | 0x30;
    ::fmt::v9::detail::buffer<char>::push_back(&dest->super_buffer<char>,(char *)local_28);
  }
  else {
    local_28[0] = (ulong)(uint)n;
    fmt.size_ = 5;
    fmt.data_ = "{:02}";
    args.field_1.values_ =
         (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_28;
    args.desc_ = 1;
    ::fmt::v9::
    vformat_to<std::back_insert_iterator<fmt::v9::basic_memory_buffer<char,_250UL,_std::allocator<char>_>_>,_0>
              ((back_insert_iterator<fmt::v9::basic_memory_buffer<char,_250UL,_std::allocator<char>_>_>
                )dest,fmt,args);
  }
  return;
}

Assistant:

inline void pad2(int n, memory_buf_t &dest)
{
    if (n >= 0 && n < 100) // 0-99
    {
        dest.push_back(static_cast<char>('0' + n / 10));
        dest.push_back(static_cast<char>('0' + n % 10));
    }
    else // unlikely, but just in case, let fmt deal with it
    {
        fmt_lib::format_to(std::back_inserter(dest), SPDLOG_FMT_STRING("{:02}"), n);
    }
}